

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membervariable.cpp
# Opt level: O0

void __thiscall
cppgenerate::MemberVariable::print
          (MemberVariable *this,ostream *stream,int indent,bool withAccessModifier)

{
  AccessModifier AVar1;
  long lVar2;
  CodeBlock *pCVar3;
  allocator local_469;
  string local_468 [32];
  string local_448 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8 [39];
  allocator local_3a1;
  string local_3a0 [39];
  allocator local_379;
  string local_378 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358 [32];
  string local_338 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8 [39];
  allocator local_2b1;
  string local_2b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250 [39];
  allocator local_229;
  string local_228 [39];
  allocator local_201;
  string local_200 [55];
  allocator local_1c9;
  string local_1c8 [36];
  undefined4 local_1a4;
  undefined1 local_1a0 [8];
  CodeBlock block;
  bool withAccessModifier_local;
  int indent_local;
  ostream *stream_local;
  MemberVariable *this_local;
  
  block.m_indent._3_1_ = withAccessModifier;
  block._380_4_ = indent;
  CodeBlock::CodeBlock((CodeBlock *)local_1a0);
  lVar2 = std::__cxx11::string::size();
  if ((lVar2 == 0) || (lVar2 = std::__cxx11::string::size(), lVar2 == 0)) {
    local_1a4 = 1;
  }
  else {
    if ((block.m_indent._3_1_ & 1) != 0) {
      AVar1 = this->m_access;
      if (AVar1 == PUBLIC) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1c8,"public:",&local_1c9);
        CodeBlock::addLine((CodeBlock *)local_1a0,(string *)local_1c8);
        std::__cxx11::string::~string(local_1c8);
        std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
      }
      else if (AVar1 == PRIVATE) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_200,"private:",&local_201);
        CodeBlock::addLine((CodeBlock *)local_1a0,(string *)local_200);
        std::__cxx11::string::~string(local_200);
        std::allocator<char>::~allocator((allocator<char> *)&local_201);
      }
      else if (AVar1 == PROTECTED) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_228,"protected:",&local_229);
        CodeBlock::addLine((CodeBlock *)local_1a0,(string *)local_228);
        std::__cxx11::string::~string(local_228);
        std::allocator<char>::~allocator((allocator<char> *)&local_229);
      }
    }
    pCVar3 = CodeBlock::indent((CodeBlock *)local_1a0);
    std::operator+(local_290,(char *)&(this->super_Variable).m_type);
    std::operator+(local_270,local_290);
    std::operator+(local_250,(char *)local_270);
    pCVar3 = CodeBlock::addLine(pCVar3,local_250);
    CodeBlock::unindent(pCVar3);
    std::__cxx11::string::~string((string *)local_250);
    std::__cxx11::string::~string((string *)local_270);
    std::__cxx11::string::~string((string *)local_290);
    if ((this->m_generateSetter & 1U) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2b0,"public:",&local_2b1);
      pCVar3 = CodeBlock::addLine((CodeBlock *)local_1a0,(string *)local_2b0);
      std::operator+((char *)local_338,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"void set"
                    );
      std::operator+(local_318,(char *)local_338);
      std::operator+(local_2f8,local_318);
      std::operator+(local_2d8,(char *)local_2f8);
      pCVar3 = CodeBlock::addLine(pCVar3,local_2d8);
      pCVar3 = CodeBlock::indent(pCVar3);
      std::operator+(local_358,(char *)&(this->super_Variable).m_name);
      pCVar3 = CodeBlock::addLine(pCVar3,local_358);
      pCVar3 = CodeBlock::unindent(pCVar3);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_378,"}",&local_379);
      CodeBlock::addLine(pCVar3,(string *)local_378);
      std::__cxx11::string::~string(local_378);
      std::allocator<char>::~allocator((allocator<char> *)&local_379);
      std::__cxx11::string::~string((string *)local_358);
      std::__cxx11::string::~string((string *)local_2d8);
      std::__cxx11::string::~string((string *)local_2f8);
      std::__cxx11::string::~string((string *)local_318);
      std::__cxx11::string::~string(local_338);
      std::__cxx11::string::~string(local_2b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
    }
    if ((this->m_generateGetter & 1U) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3a0,"public:",&local_3a1);
      pCVar3 = CodeBlock::addLine((CodeBlock *)local_1a0,(string *)local_3a0);
      std::operator+(local_408,(char *)&(this->super_Variable).m_type);
      std::operator+(local_3e8,local_408);
      std::operator+(local_3c8,(char *)local_3e8);
      pCVar3 = CodeBlock::addLine(pCVar3,local_3c8);
      pCVar3 = CodeBlock::indent(pCVar3);
      std::operator+((char *)local_448,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"return ")
      ;
      std::operator+(local_428,(char *)local_448);
      pCVar3 = CodeBlock::addLine(pCVar3,local_428);
      pCVar3 = CodeBlock::unindent(pCVar3);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_468,"}",&local_469);
      CodeBlock::addLine(pCVar3,(string *)local_468);
      std::__cxx11::string::~string(local_468);
      std::allocator<char>::~allocator((allocator<char> *)&local_469);
      std::__cxx11::string::~string((string *)local_428);
      std::__cxx11::string::~string(local_448);
      std::__cxx11::string::~string((string *)local_3c8);
      std::__cxx11::string::~string((string *)local_3e8);
      std::__cxx11::string::~string((string *)local_408);
      std::__cxx11::string::~string(local_3a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
    }
    CodeBlock::print((CodeBlock *)local_1a0,stream);
    local_1a4 = 0;
  }
  CodeBlock::~CodeBlock((CodeBlock *)local_1a0);
  return;
}

Assistant:

void MemberVariable::print( std::ostream& stream, int indent, bool withAccessModifier ) const {
    cppgenerate::CodeBlock block;

    if( m_name.size() == 0 || m_type.size() == 0 ){
        //Can't generate code for this memvar
        return;
    }

    if( withAccessModifier ){
        switch( m_access ){
            case AccessModifier::PUBLIC:
                block.addLine( "public:");
                break;
            case AccessModifier::PRIVATE:
                block.addLine( "private:");
                break;
            case AccessModifier::PROTECTED:
                block.addLine( "protected:");
                break;
        }
    }

    block.indent()
        .addLine( m_type + " " + m_name + ";" )
        .unindent();

    if( m_generateSetter ){
        block.addLine( "public:" )
            .addLine( "void set" + m_name + "( " + m_type + " arg ){" )
            .indent()
            .addLine( m_name + " = arg;" )
            .unindent()
            .addLine( "}" );
    }

    if( m_generateGetter ){
        block.addLine( "public:" )
            .addLine( m_type + " get" + m_name + "(){" )
            .indent()
            .addLine( "return " + m_name + ";" )
            .unindent()
            .addLine( "}" );
    }

    block.print( stream );
}